

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupContextItem(char *str_id,int mouse_button)

{
  ImGuiWindow *this;
  bool bVar1;
  ImGuiID local_30;
  ImGuiID id;
  ImGuiWindow *window;
  int mouse_button_local;
  char *str_id_local;
  
  this = GImGui->CurrentWindow;
  if ((this->SkipItems & 1U) == 0) {
    if (str_id == (char *)0x0) {
      local_30 = (this->DC).LastItemId;
    }
    else {
      local_30 = ImGuiWindow::GetID(this,str_id,(char *)0x0);
    }
    if (local_30 == 0) {
      __assert_fail("id != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                    ,0x1d4a,"bool ImGui::BeginPopupContextItem(const char *, int)");
    }
    bVar1 = IsMouseReleased(mouse_button);
    if ((bVar1) && (bVar1 = IsItemHovered(8), bVar1)) {
      OpenPopupEx(local_30);
    }
    str_id_local._7_1_ = BeginPopupEx(local_30,0x141);
  }
  else {
    str_id_local._7_1_ = false;
  }
  return str_id_local._7_1_;
}

Assistant:

bool ImGui::BeginPopupContextItem(const char* str_id, int mouse_button)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    if (window->SkipItems)
        return false;
    ImGuiID id = str_id ? window->GetID(str_id) : window->DC.LastItemId; // If user hasn't passed an ID, we can use the LastItemID. Using LastItemID as a Popup ID won't conflict!
    IM_ASSERT(id != 0);                                                  // You cannot pass a NULL str_id if the last item has no identifier (e.g. a Text() item)
    if (IsMouseReleased(mouse_button) && IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
        OpenPopupEx(id);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize|ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoSavedSettings);
}